

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void test_all_maps<HashObject<8,8>>(int obj_size,int iters)

{
  pointer ppVar1;
  float fVar2;
  type tVar3;
  _Hash_node_base *p_Var4;
  iterator iVar5;
  iterator iVar6;
  uint uVar7;
  long lVar8;
  value_type *pvVar9;
  long lVar10;
  iterator iVar11;
  value_type *pvVar12;
  value_type *pvVar13;
  value_type *pvVar14;
  uint *puVar15;
  iterator iVar16;
  mapped_type *pmVar17;
  type tVar18;
  iterator iVar19;
  pointer psVar20;
  pointer ppVar21;
  pointer end_memory;
  uchar *puVar22;
  size_t start_memory;
  size_t start_memory_00;
  pointer psVar23;
  size_t start_memory_01;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  pointer psVar24;
  type tVar25;
  size_t start_memory_05;
  size_t start_memory_06;
  key_type kVar26;
  key_type kVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  bool bVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_HashObject<8,_8>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_HashObject<8,_8>,_int>_>_>
  pVar52;
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  uint local_174;
  undefined1 local_170 [16];
  type local_160;
  type tStack_158;
  type local_150;
  type local_148;
  vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  vStack_140;
  pointer local_120;
  undefined1 local_118 [8];
  iterator iStack_110;
  iterator local_108;
  iterator iStack_100;
  pointer local_f8;
  iterator iStack_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  nonempty_iterator local_d8;
  size_type local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  double local_b0;
  int local_a8;
  libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_> local_a2;
  equal_to<HashObject<8,_8>_*> local_a1;
  long local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  HashObject<8,_8> local_80;
  undefined1 local_78 [8];
  iterator iStack_70;
  iterator local_68;
  iterator iStack_60;
  pointer local_58;
  iterator iStack_50;
  iterator local_48;
  iterator iStack_40;
  nonempty_iterator local_38;
  
  psVar24 = (pointer)(ulong)(uint)obj_size;
  iVar19._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)psVar24;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",8);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      pvVar9->second = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)iVar19._M_current
        );
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_140);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  local_c8 = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)local_170,local_c8);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      pvVar9->second = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,
         (size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_140);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      pvVar9->second = uVar30;
    } while (obj_size != uVar30);
  }
  uVar30 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      pvVar9->second = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,
         (size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_140);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar19._M_current =
         (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar22 = psVar24[-1].bitmap + 5;
    auVar35._8_4_ = (int)puVar22;
    auVar35._0_8_ = puVar22;
    auVar35._12_4_ = (int)((ulong)puVar22 >> 0x20);
    psVar20 = (pointer)0x0;
    auVar35 = auVar35 ^ _DAT_0013b020;
    auVar50 = _DAT_0013b010;
    do {
      auVar49 = auVar50 ^ auVar51;
      if ((bool)(~(auVar35._4_4_ < auVar49._4_4_ ||
                  auVar35._0_4_ < auVar49._0_4_ && auVar49._4_4_ == auVar35._4_4_) & 1)) {
        *(int *)(local_170._0_8_ + (long)psVar20 * 4) = (int)psVar20;
      }
      if (auVar49._12_4_ <= auVar35._12_4_ &&
          (auVar49._8_4_ <= auVar35._8_4_ || auVar49._12_4_ != auVar35._12_4_)) {
        *(int *)(local_170._0_8_ + (long)psVar20 * 4 + 4) = (int)psVar20 + 1;
      }
      psVar20 = (pointer)((long)&psVar20->group + 2);
      lVar8 = auVar50._8_8_;
      auVar50._0_8_ = auVar50._0_8_ + 2;
      auVar50._8_8_ = lVar8 + 2;
    } while ((pointer)iVar19._M_current != psVar20);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_170);
  time_map_fetch<EasyUseSparseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_170,"map_fetch_random");
  if ((__buckets_ptr)local_170._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_170._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar19._M_current =
         (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar22 = psVar24[-1].bitmap + 5;
    auVar36._8_4_ = (int)puVar22;
    auVar36._0_8_ = puVar22;
    auVar36._12_4_ = (int)((ulong)puVar22 >> 0x20);
    psVar20 = (pointer)0x0;
    auVar36 = auVar36 ^ _DAT_0013b020;
    auVar49 = _DAT_0013b010;
    do {
      auVar50 = auVar49 ^ auVar51;
      if ((bool)(~(auVar36._4_4_ < auVar50._4_4_ ||
                  auVar36._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar36._4_4_) & 1)) {
        *(int *)(local_170._0_8_ + (long)psVar20 * 4) = (int)psVar20;
      }
      if (auVar50._12_4_ <= auVar36._12_4_ &&
          (auVar50._8_4_ <= auVar36._8_4_ || auVar50._12_4_ != auVar36._12_4_)) {
        *(int *)(local_170._0_8_ + (long)psVar20 * 4 + 4) = (int)psVar20 + 1;
      }
      psVar20 = (pointer)((long)&psVar20->group + 2);
      lVar8 = auVar49._8_8_;
      auVar49._0_8_ = auVar49._0_8_ + 2;
      auVar49._8_8_ = lVar8 + 2;
    } while ((pointer)iVar19._M_current != psVar20);
  }
  time_map_fetch<EasyUseSparseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_170,"map_fetch_sequential");
  if ((__buckets_ptr)local_170._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_170._0_8_);
  }
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  if (0 < obj_size) {
    uVar29 = 0;
    do {
      local_80.buffer_ = (char  [4])((uVar29 & 0xff) * 0x1010101);
      local_80.i_ = uVar29;
      google::
      sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
      ::find<HashObject<8,8>>
                ((iterator *)local_118,
                 (sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                  *)local_170,&local_80);
      iStack_70._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_140.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_68._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_140.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      iStack_60._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_140.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = (pointer)0x0;
      iStack_50._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_140.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_48._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_140.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      iStack_40._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_140.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = (nonempty_iterator)0x0;
      local_78 = (undefined1  [8])local_170;
      google::
      sparse_hashtable_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::advance_past_deleted
                ((sparse_hashtable_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                  *)local_78);
      uVar7 = 1;
      iVar19._M_current = iStack_110._M_current;
      if (((iStack_110._M_current == iStack_70._M_current) &&
          (iVar19._M_current = local_108._M_current, local_108._M_current == local_68._M_current))
         && (iStack_100._M_current == iStack_60._M_current)) {
        if (iStack_100._M_current == local_108._M_current) {
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)(local_f8 != local_58);
          iVar19._M_current =
               (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                *)local_f8;
        }
      }
      uVar30 = uVar30 ^ uVar7;
      uVar29 = uVar29 + 1;
    } while (obj_size != uVar29);
  }
  lVar10 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar10 - lVar8),obj_size,start_memory,(size_t)iVar19._M_current)
  ;
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_140);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      pvVar9->second = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      google::
      sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,
         (size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_140);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_170,(key_type *)local_118);
      uVar29 = uVar30 + 1;
      pvVar9->second = uVar29;
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      google::
      sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170,(key_type *)local_118);
      uVar30 = uVar29;
    } while (uVar29 != obj_size);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,
         (size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_140);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      pvVar9->second = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  google::
  sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::begin((iterator *)local_78,
          (sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
           *)local_170);
  local_118 = local_78;
  iStack_110._M_current = iStack_70._M_current;
  local_108._M_current = local_68._M_current;
  iStack_100._M_current = iStack_60._M_current;
  local_f8 = local_58;
  iStack_f0._M_current = iStack_50._M_current;
  local_e8 = local_48._M_current._0_4_;
  uStack_e4 = local_48._M_current._4_4_;
  uStack_e0 = iStack_40._M_current._0_4_;
  uStack_dc = iStack_40._M_current._4_4_;
  local_d8 = local_38;
  iStack_70._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_140.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_68._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_140.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  iStack_60._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_140.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (pointer)0x0;
  iStack_50._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_140.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_48._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_140.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  iStack_40._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_140.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (nonempty_iterator)0x0;
  local_78 = (undefined1  [8])local_170;
  google::
  sparse_hashtable_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::advance_past_deleted
            ((sparse_hashtable_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
              *)local_78);
  psVar20 = local_58;
  iVar6._M_current = iStack_60._M_current;
  iVar5._M_current = local_68._M_current;
  iVar19._M_current = iStack_70._M_current;
  uVar30 = 1;
  while (((iStack_110._M_current != iVar19._M_current || (local_108._M_current != iVar5._M_current))
         || ((iStack_100._M_current != iVar6._M_current ||
             ((iStack_100._M_current != local_108._M_current && (local_f8 != psVar20))))))) {
    uVar30 = uVar30 ^ *(uint *)&local_f8->settings;
    local_f8 = (pointer)(local_f8->bitmap + 2);
    iVar11._M_current = iStack_100._M_current;
    if (local_f8 ==
        (pointer)(((HashObject<8,_8> *)&((pointer)(iStack_100._M_current)->group)->first)->buffer_ +
                 ((ulong)((uint)((iStack_100._M_current)->settings).num_buckets * 0xc) - 4))) {
      do {
        iVar11._M_current = iStack_100._M_current + 1;
        if (iVar11._M_current == local_108._M_current) break;
        local_f8 = (pointer)((pointer)iVar11._M_current)->group;
        psVar23 = (pointer)iStack_100._M_current + 1;
        iStack_100._M_current = iVar11._M_current;
      } while (((Settings *)&psVar23->settings)->num_buckets == 0);
    }
    iStack_100._M_current = iVar11._M_current;
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                *)local_118);
  }
  iVar19._M_current = iStack_100._M_current;
  lVar10 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar10 - lVar8),obj_size,start_memory_00,(size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_140);
  putchar(10);
  local_a8 = obj_size + 3;
  if (-1 < obj_size) {
    local_a8 = obj_size;
  }
  local_a8 = local_a8 >> 2;
  lVar8 = 0;
  do {
    uVar32 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar8];
    local_174 = 1;
    local_a0 = lVar8;
    local_98 = uVar32;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      iVar28 = local_a8 / (int)uVar32;
      google::
      sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
      ::sparse_hashtable((sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                          *)local_170,0,(HashFn *)&local_80,&local_a1,(SelectKey *)local_118,
                         (SetKey *)local_78,&local_a2);
      dVar34 = NAN;
      local_bc = iVar28;
      if (0 < iVar28) {
        local_b0 = 0.0;
        iVar28 = 0;
        iVar31 = 0;
        do {
          google::
          sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
          ::clear((sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                   *)local_170);
          google::
          sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
          ::resize((sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                    *)local_170,uVar32);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_b8 = iVar31;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar30 = (int)uVar32 >> 0x1f;
          iVar31 = (int)((long)((ulong)uVar30 << 0x20 | uVar32 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_174));
          if (-1 < iVar31) {
            uVar29 = iVar31 + 1;
            local_88 = (ulong)uVar29;
            local_b4 = (int)((long)((ulong)uVar30 << 0x20 | uVar32 & 0xffffffff) / (long)(int)uVar29
                            );
            uVar32 = 0;
            kVar27 = (key_type)(long)(int)local_174;
            do {
              kVar26 = kVar27;
              iVar31 = local_b4;
              if (0 < local_b4) {
                do {
                  local_118 = (undefined1  [8])kVar26;
                  pvVar12 = google::
                            sparse_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                            ::
                            find_or_insert<google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::DefaultValue>
                                      ((sparse_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                                        *)local_170,(key_type *)local_118);
                  iVar28 = iVar28 + 1;
                  pvVar12->second = iVar28;
                  kVar26 = (key_type)((long)kVar26 + (long)(int)local_174);
                  iVar31 = iVar31 + -1;
                } while (iVar31 != 0);
              }
              uVar32 = uVar32 + 1;
              kVar27 = (key_type)((long)kVar27 + 1);
            } while (uVar32 != local_88);
          }
          lVar8 = std::chrono::_V2::steady_clock::now();
          local_b0 = local_b0 + (double)(lVar8 - local_90);
          iVar31 = local_b8 + 1;
          uVar32 = local_98;
        } while (iVar31 != local_bc);
        dVar34 = local_b0 / (double)iVar28;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar34,
             uVar32 & 0xffffffff,(ulong)local_174);
      std::
      vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
      ::~vector(&vStack_140);
      local_174 = local_174 * (int)uVar32;
    } while ((int)local_174 <= (int)uVar32);
    lVar8 = local_a0 + 1;
  } while (local_a0 == 0);
  uVar30 = 0;
  psVar20 = psVar24;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",8);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar13 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_170,(HashObject<8,_8> *)local_118);
      uVar30 = uVar30 + 1;
      pvVar13->second = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  google::
  dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)local_170,local_c8);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar13 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_170,(HashObject<8,_8> *)local_118);
      uVar30 = uVar30 + 1;
      pvVar13->second = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar13 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_170,(HashObject<8,_8> *)local_118);
      uVar30 = uVar30 + 1;
      pvVar13->second = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar13 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_170,(HashObject<8,_8> *)local_118);
      uVar30 = uVar30 + 1;
      pvVar13->second = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar22 = psVar24[-1].bitmap + 5;
    auVar37._8_4_ = (int)puVar22;
    auVar37._0_8_ = puVar22;
    auVar37._12_4_ = (int)((ulong)puVar22 >> 0x20);
    psVar23 = (pointer)0x0;
    auVar37 = auVar37 ^ _DAT_0013b020;
    auVar43 = _DAT_0013b010;
    do {
      auVar50 = auVar43 ^ auVar51;
      if ((bool)(~(auVar37._4_4_ < auVar50._4_4_ ||
                  auVar37._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar37._4_4_) & 1)) {
        *(int *)(local_170._0_8_ + (long)psVar23 * 4) = (int)psVar23;
      }
      if (auVar50._12_4_ <= auVar37._12_4_ &&
          (auVar50._8_4_ <= auVar37._8_4_ || auVar50._12_4_ != auVar37._12_4_)) {
        *(int *)(local_170._0_8_ + (long)psVar23 * 4 + 4) = (int)psVar23 + 1;
      }
      psVar23 = (pointer)((long)&psVar23->group + 2);
      lVar8 = auVar43._8_8_;
      auVar43._0_8_ = auVar43._0_8_ + 2;
      auVar43._8_8_ = lVar8 + 2;
    } while (psVar20 != psVar23);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_170);
  time_map_fetch<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_170,"map_fetch_random");
  if ((__buckets_ptr)local_170._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_170._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar22 = psVar24[-1].bitmap + 5;
    auVar38._8_4_ = (int)puVar22;
    auVar38._0_8_ = puVar22;
    auVar38._12_4_ = (int)((ulong)puVar22 >> 0x20);
    psVar23 = (pointer)0x0;
    auVar38 = auVar38 ^ _DAT_0013b020;
    auVar44 = _DAT_0013b010;
    do {
      auVar50 = auVar44 ^ auVar51;
      if ((bool)(~(auVar38._4_4_ < auVar50._4_4_ ||
                  auVar38._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar38._4_4_) & 1)) {
        *(int *)(local_170._0_8_ + (long)psVar23 * 4) = (int)psVar23;
      }
      if (auVar50._12_4_ <= auVar38._12_4_ &&
          (auVar50._8_4_ <= auVar38._8_4_ || auVar50._12_4_ != auVar38._12_4_)) {
        *(int *)(local_170._0_8_ + (long)psVar23 * 4 + 4) = (int)psVar23 + 1;
      }
      psVar23 = (pointer)((long)&psVar23->group + 2);
      lVar8 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + 2;
      auVar44._8_8_ = lVar8 + 2;
    } while (psVar20 != psVar23);
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_170,"map_fetch_sequential");
  if ((__buckets_ptr)local_170._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_170._0_8_);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  uVar29 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  if (0 < obj_size) {
    do {
      local_78._4_4_ = (uVar29 & 0xff) * 0x1010101;
      local_78._0_4_ = uVar29;
      google::
      dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
      ::find<HashObject<8,8>>
                ((iterator *)local_118,
                 (dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                  *)local_170,(HashObject<8,_8> *)local_78);
      bVar33 = (pointer)iStack_110._M_current !=
               (pointer)((long)&local_120->first +
                        (long)vStack_140.
                              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage * 0xc);
      psVar20 = (pointer)(ulong)bVar33;
      uVar30 = uVar30 ^ bVar33;
      uVar29 = uVar29 + 1;
    } while (obj_size != uVar29);
  }
  lVar10 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar10 - lVar8),obj_size,start_memory_01,(size_t)psVar20);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar13 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_170,(HashObject<8,_8> *)local_118);
      uVar30 = uVar30 + 1;
      pvVar13->second = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      google::
      dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar13 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_170,(HashObject<8,_8> *)local_118);
      uVar29 = uVar30 + 1;
      pvVar13->second = uVar29;
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      google::
      dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170,(HashObject<8,_8> *)local_118);
      uVar30 = uVar29;
    } while (uVar29 != obj_size);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_170);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pvVar13 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_170,(HashObject<8,_8> *)local_118);
      uVar30 = uVar30 + 1;
      pvVar13->second = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  ppVar1 = (pointer)((long)&local_120->first +
                    (long)vStack_140.
                          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage * 0xc);
  end_memory = local_120;
  if (vStack_140.
      super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    lVar10 = (long)vStack_140.
                   super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage * 0xc;
    do {
      fVar2 = (float)((HashObject<8,_8> *)&end_memory->first)->i_;
      if (((float)local_148.i_ != fVar2) &&
         (vStack_140.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0 || (float)local_150.i_ != fVar2)
         ) break;
      end_memory = (pointer)&end_memory->field_0xc;
      lVar10 = lVar10 + -0xc;
    } while (lVar10 != 0);
  }
  if (end_memory == ppVar1) {
    uVar30 = 1;
  }
  else {
    uVar30 = 1;
    ppVar21 = end_memory;
LAB_0011f4b5:
    do {
      end_memory = (pointer)&end_memory->field_0xc;
      if (end_memory != ppVar1) {
        if (((float)local_148.i_ == *(float *)end_memory) ||
           (vStack_140.
            super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0 &&
            (float)local_150.i_ == *(float *)end_memory)) goto LAB_0011f4b5;
      }
      uVar30 = uVar30 ^ ppVar21->second;
      ppVar21 = end_memory;
    } while (end_memory != ppVar1);
  }
  lVar10 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar10 - lVar8),obj_size,start_memory_02,(size_t)end_memory);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  putchar(10);
  lVar8 = 0;
  do {
    uVar32 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar8];
    local_174 = 1;
    local_a0 = lVar8;
    local_98 = uVar32;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      iVar28 = local_a8 / (int)uVar32;
      EasyUseDenseHashMap<HashObject<8,_8>_*,_int,_HashFn>::EasyUseDenseHashMap
                ((EasyUseDenseHashMap<HashObject<8,_8>_*,_int,_HashFn> *)local_170);
      dVar34 = NAN;
      local_bc = iVar28;
      if (0 < iVar28) {
        local_b0 = 0.0;
        iVar31 = 0;
        iVar28 = 0;
        do {
          google::
          dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
          ::clear((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                   *)local_170);
          google::
          dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
          ::resize((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                    *)local_170,uVar32);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_b8 = iVar28;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar30 = (int)uVar32 >> 0x1f;
          iVar28 = (int)((long)((ulong)uVar30 << 0x20 | uVar32 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_174));
          if (-1 < iVar28) {
            uVar29 = iVar28 + 1;
            local_88 = (ulong)uVar29;
            local_b4 = (int)((long)((ulong)uVar30 << 0x20 | uVar32 & 0xffffffff) / (long)(int)uVar29
                            );
            uVar32 = 0;
            kVar27 = (key_type)(long)(int)local_174;
            do {
              kVar26 = kVar27;
              iVar28 = local_b4;
              if (0 < local_b4) {
                do {
                  local_118 = (undefined1  [8])kVar26;
                  pvVar14 = google::
                            dense_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                            ::find_or_insert<int,HashObject<8,8>*>
                                      ((dense_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                                        *)local_170,(HashObject<8,_8> **)local_118);
                  iVar31 = iVar31 + 1;
                  pvVar14->second = iVar31;
                  kVar26 = (key_type)((long)kVar26 + (long)(int)local_174);
                  iVar28 = iVar28 + -1;
                } while (iVar28 != 0);
              }
              uVar32 = uVar32 + 1;
              kVar27 = (key_type)((long)kVar27 + 1);
            } while (uVar32 != local_88);
          }
          lVar8 = std::chrono::_V2::steady_clock::now();
          local_b0 = local_b0 + (double)(lVar8 - local_90);
          iVar28 = local_b8 + 1;
          uVar32 = local_98;
        } while (iVar28 != local_bc);
        dVar34 = local_b0 / (double)iVar31;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar34,
             uVar32 & 0xffffffff,(ulong)local_174);
      if (local_120 != (pointer)0x0) {
        free(local_120);
      }
      local_174 = local_174 * (int)uVar32;
    } while ((int)local_174 <= (int)uVar32);
    lVar8 = local_a0 + 1;
  } while (local_a0 == 0);
  psVar20 = psVar24;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",8);
  local_170._0_8_ = &vStack_140;
  local_170._8_8_ = (pointer)0x1;
  local_160 = (type)0x0;
  tStack_158 = (type)0x0;
  local_150.i_ = 0x3f800000;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  vStack_140.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_170);
  local_170._0_8_ = &vStack_140;
  local_170._8_8_ = (pointer)0x1;
  local_160 = (type)0x0;
  tStack_158 = (type)0x0;
  local_150.i_ = 0x3f800000;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  vStack_140.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)local_170,local_c8);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_170);
  local_170._0_8_ = &vStack_140;
  local_170._8_8_ = (pointer)0x1;
  local_160 = (type)0x0;
  tStack_158 = (type)0x0;
  local_150.i_ = 0x3f800000;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  vStack_140.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  uVar30 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    auVar51 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
    std::
    _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_170);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
  }
  else {
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
    auVar51 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
    std::
    _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_170);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
    auVar51 = _DAT_0013b020;
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar22 = psVar24[-1].bitmap + 5;
    auVar39._8_4_ = (int)puVar22;
    auVar39._0_8_ = puVar22;
    auVar39._12_4_ = (int)((ulong)puVar22 >> 0x20);
    psVar23 = (pointer)0x0;
    auVar39 = auVar39 ^ _DAT_0013b020;
    auVar45 = _DAT_0013b010;
    do {
      auVar50 = auVar45 ^ auVar51;
      if ((bool)(~(auVar39._4_4_ < auVar50._4_4_ ||
                  auVar39._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar39._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_170._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar23 * 4) = (int)psVar23;
      }
      if (auVar50._12_4_ <= auVar39._12_4_ &&
          (auVar50._8_4_ <= auVar39._8_4_ || auVar50._12_4_ != auVar39._12_4_)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_170._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar23 * 4 + 4) = (int)psVar23 + 1;
      }
      psVar23 = (pointer)((long)&psVar23->group + 2);
      lVar8 = auVar45._8_8_;
      auVar45._0_8_ = auVar45._0_8_ + 2;
      auVar45._8_8_ = lVar8 + 2;
    } while (psVar20 != psVar23);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_170);
  time_map_fetch<EasyUseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_170,"map_fetch_random");
  if ((vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)local_170._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_170._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar22 = psVar24[-1].bitmap + 5;
    auVar40._8_4_ = (int)puVar22;
    auVar40._0_8_ = puVar22;
    auVar40._12_4_ = (int)((ulong)puVar22 >> 0x20);
    psVar23 = (pointer)0x0;
    auVar40 = auVar40 ^ _DAT_0013b020;
    auVar46 = _DAT_0013b010;
    do {
      auVar50 = auVar46 ^ auVar51;
      if ((bool)(~(auVar40._4_4_ < auVar50._4_4_ ||
                  auVar40._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar40._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_170._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar23 * 4) = (int)psVar23;
      }
      if (auVar50._12_4_ <= auVar40._12_4_ &&
          (auVar50._8_4_ <= auVar40._8_4_ || auVar50._12_4_ != auVar40._12_4_)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_170._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar23 * 4 + 4) = (int)psVar23 + 1;
      }
      psVar23 = (pointer)((long)&psVar23->group + 2);
      lVar8 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 2;
      auVar46._8_8_ = lVar8 + 2;
    } while (psVar20 != psVar23);
  }
  time_map_fetch<EasyUseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_170,"map_fetch_sequential");
  if ((vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)local_170._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_170._0_8_);
  }
  local_170._0_8_ = &vStack_140;
  local_170._8_8_ = (pointer)0x1;
  local_160 = (type)0x0;
  tStack_158 = (type)0x0;
  local_150.i_ = 0x3f800000;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  vStack_140.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar30 = 1;
  }
  else {
    uVar30 = 1;
    uVar29 = 0;
    do {
      local_118._4_4_ = (uVar29 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar29;
      iVar16 = std::
               _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_170,(key_type *)local_118);
      psVar20 = (pointer)(ulong)(iVar16.
                                 super__Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true>
                                 ._M_cur != (__node_type *)0x0);
      uVar30 = uVar30 ^ iVar16.
                        super__Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
      uVar29 = uVar29 + 1;
    } while (obj_size != uVar29);
  }
  lVar10 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar10 - lVar8),obj_size,start_memory_03,(size_t)psVar20);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_170);
  local_170._0_8_ = &vStack_140;
  local_170._8_8_ = (pointer)0x1;
  local_160 = (type)0x0;
  tStack_158 = (type)0x0;
  local_150.i_ = 0x3f800000;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  vStack_140.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      std::
      _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_170,local_118);
      uVar30 = uVar30 + 1;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_170);
  local_170._0_8_ = &vStack_140;
  local_170._8_8_ = (pointer)0x1;
  local_160 = (type)0x0;
  tStack_158 = (type)0x0;
  local_150.i_ = 0x3f800000;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  vStack_140.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_170,(key_type *)local_118);
      uVar29 = uVar30 + 1;
      *puVar15 = uVar29;
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      std::
      _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_170,(key_type *)local_118);
      uVar30 = uVar29;
    } while (uVar29 != obj_size);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_170);
  local_170._0_8_ = &vStack_140;
  local_170._8_8_ = (pointer)0x1;
  local_160 = (type)0x0;
  tStack_158 = (type)0x0;
  local_150.i_ = 0x3f800000;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  vStack_140.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  for (tVar3 = local_160; tVar3 != (type)0x0; tVar3 = (type)((_Hash_node_base *)tVar3)->_M_nxt) {
    uVar30 = uVar30 ^ *(uint *)&((_Hash_node_base *)((long)tVar3 + 0x10))->_M_nxt;
  }
  lVar10 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar10 - lVar8),obj_size,start_memory_04,(size_t)psVar20);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_170);
  putchar(10);
  lVar8 = 0;
  do {
    uVar32 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar8];
    local_174 = 1;
    local_a0 = lVar8;
    local_98 = uVar32;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      local_bc = local_a8 / (int)uVar32;
      local_170._0_8_ = &vStack_140;
      local_170._8_8_ = (pointer)0x1;
      local_160 = (type)0x0;
      tStack_158 = (type)0x0;
      local_150.i_ = 0x3f800000;
      local_148.i_ = 0;
      local_148.buffer_[0] = '\0';
      local_148.buffer_[1] = '\0';
      local_148.buffer_[2] = '\0';
      local_148.buffer_[3] = '\0';
      vStack_140.
      super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dVar34 = NAN;
      if (0 < local_bc) {
        iVar31 = 0;
        iVar28 = 0;
        dVar34 = 0.0;
        tVar3 = local_160;
        do {
          while (local_b0 = dVar34, local_b8 = iVar28, tVar3 != (type)0x0) {
            p_Var4 = ((_Hash_node_base *)tVar3)->_M_nxt;
            operator_delete((void *)tVar3);
            iVar28 = local_b8;
            dVar34 = local_b0;
            tVar3 = (type)p_Var4;
          }
          memset((void *)local_170._0_8_,0,local_170._8_8_ << 3);
          local_160 = (type)0x0;
          tStack_158 = (type)0x0;
          std::
          _Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::rehash((_Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_170,uVar32);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar30 = (int)uVar32 >> 0x1f;
          iVar28 = (int)((long)((ulong)uVar30 << 0x20 | uVar32 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_174));
          if (-1 < iVar28) {
            uVar29 = iVar28 + 1;
            local_88 = (ulong)uVar29;
            local_b4 = (int)((long)((ulong)uVar30 << 0x20 | uVar32 & 0xffffffff) / (long)(int)uVar29
                            );
            uVar32 = 0;
            kVar27 = (key_type)(long)(int)local_174;
            do {
              kVar26 = kVar27;
              iVar28 = local_b4;
              if (0 < local_b4) {
                do {
                  local_118 = (undefined1  [8])kVar26;
                  pmVar17 = std::__detail::
                            _Map_base<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_170,(key_type *)local_118);
                  iVar31 = iVar31 + 1;
                  *pmVar17 = iVar31;
                  kVar26 = (key_type)((long)kVar26 + (long)(int)local_174);
                  iVar28 = iVar28 + -1;
                } while (iVar28 != 0);
              }
              uVar32 = uVar32 + 1;
              kVar27 = (key_type)((long)kVar27 + 1);
            } while (uVar32 != local_88);
          }
          lVar8 = std::chrono::_V2::steady_clock::now();
          dVar34 = local_b0 + (double)(lVar8 - local_90);
          iVar28 = local_b8 + 1;
          tVar3 = local_160;
          uVar32 = local_98;
        } while (local_b8 + 1 != local_bc);
        dVar34 = dVar34 / (double)iVar31;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar34,
             uVar32 & 0xffffffff,(ulong)local_174);
      std::
      _Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_170);
      local_174 = local_174 * (int)uVar32;
    } while ((int)local_174 <= (int)uVar32);
    lVar8 = local_a0 + 1;
  } while (local_a0 == 0);
  psVar20 = psVar24;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",8);
  tVar3 = (type)((long)local_170 + 8);
  local_170._8_8_ = local_170._8_8_ & 0xffffffff00000000;
  local_160 = (type)0x0;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_158 = tVar3;
  local_150 = tVar3;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170);
  local_170._8_8_ = local_170._8_8_ & 0xffffffff00000000;
  local_160 = (type)0x0;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_158 = tVar3;
  local_150 = tVar3;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170);
  local_170._8_8_ = local_170._8_8_ & 0xffffffff00000000;
  local_160 = (type)0x0;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_158 = tVar3;
  local_150 = tVar3;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    auVar51 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
    std::
    _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                 *)local_170);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
  }
  else {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
    auVar51 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
    std::
    _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                 *)local_170);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
    auVar51 = _DAT_0013b020;
    if (0 < obj_size) {
      psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
      puVar22 = psVar24[-1].bitmap + 5;
      auVar41._8_4_ = (int)puVar22;
      auVar41._0_8_ = puVar22;
      auVar41._12_4_ = (int)((ulong)puVar22 >> 0x20);
      psVar23 = (pointer)0x0;
      auVar41 = auVar41 ^ _DAT_0013b020;
      auVar47 = _DAT_0013b010;
      do {
        auVar50 = auVar47 ^ auVar51;
        if ((bool)(~(auVar50._4_4_ == auVar41._4_4_ && auVar41._0_4_ < auVar50._0_4_ ||
                    auVar41._4_4_ < auVar50._4_4_) & 1)) {
          *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                             *)local_170._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                  (long)psVar23 * 4) = (int)psVar23;
        }
        if ((auVar50._12_4_ != auVar41._12_4_ || auVar50._8_4_ <= auVar41._8_4_) &&
            auVar50._12_4_ <= auVar41._12_4_) {
          *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                             *)local_170._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                  (long)psVar23 * 4 + 4) = (int)psVar23 + 1;
        }
        psVar23 = (pointer)((long)&psVar23->group + 2);
        lVar8 = auVar47._8_8_;
        auVar47._0_8_ = auVar47._0_8_ + 2;
        auVar47._8_8_ = lVar8 + 2;
      } while (psVar20 != psVar23);
    }
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_170);
  time_map_fetch<EasyUseMap<HashObject<8,8>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_170,"map_fetch_random");
  if ((vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)local_170._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_170._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,local_c8,(allocator_type *)local_118);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar22 = psVar24[-1].bitmap + 5;
    auVar42._8_4_ = (int)puVar22;
    auVar42._0_8_ = puVar22;
    auVar42._12_4_ = (int)((ulong)puVar22 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar42 = auVar42 ^ _DAT_0013b020;
    auVar48 = _DAT_0013b010;
    do {
      auVar50 = auVar48 ^ auVar51;
      if ((bool)(~(auVar50._4_4_ == auVar42._4_4_ && auVar42._0_4_ < auVar50._0_4_ ||
                  auVar42._4_4_ < auVar50._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_170._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar24 * 4) = (int)psVar24;
      }
      if ((auVar50._12_4_ != auVar42._12_4_ || auVar50._8_4_ <= auVar42._8_4_) &&
          auVar50._12_4_ <= auVar42._12_4_) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_170._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar24 * 4 + 4) = (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar8 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + 2;
      auVar48._8_8_ = lVar8 + 2;
    } while (psVar20 != psVar24);
  }
  time_map_fetch<EasyUseMap<HashObject<8,8>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_170,"map_fetch_sequential");
  if ((vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)local_170._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_170._0_8_);
  }
  local_170._8_8_ = local_170._8_8_ & 0xffffffff00000000;
  local_160.i_ = 0;
  local_160.buffer_[0] = '\0';
  local_160.buffer_[1] = '\0';
  local_160.buffer_[2] = '\0';
  local_160.buffer_[3] = '\0';
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_158 = tVar3;
  local_150 = tVar3;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar30 = 1;
  }
  else {
    uVar30 = 1;
    psVar20 = (pointer)0x0;
    do {
      iVar28 = (int)psVar20;
      tVar25 = tVar3;
      for (tVar18 = local_160; tVar18 != (type)0x0;
          tVar18 = *(type *)((undefined1 *)((long)tVar18 + 0x10) +
                            (ulong)(*(int *)((long)tVar18 + 0x20) < iVar28) * 8)) {
        if (iVar28 <= *(int *)((long)tVar18 + 0x20)) {
          tVar25 = tVar18;
        }
      }
      tVar18 = tVar3;
      if ((tVar25 != tVar3) && (tVar18 = tVar25, iVar28 < *(int *)((long)tVar25 + 0x20))) {
        tVar18 = tVar3;
      }
      uVar30 = uVar30 ^ tVar18 != tVar3;
      psVar20 = (pointer)(ulong)(iVar28 + 1U);
    } while (iVar28 + 1U != obj_size);
  }
  lVar10 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar10 - lVar8),obj_size,start_memory_05,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170);
  tVar3 = (type)((long)local_170 + 8);
  local_170._8_8_ = local_170._8_8_ & 0xffffffff00000000;
  local_160 = (type)0x0;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_158 = tVar3;
  local_150 = tVar3;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      pVar52 = std::
               _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                              *)local_170,(key_type *)local_118);
      std::
      _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                      *)local_170,(_Base_ptr)pVar52.first._M_node,(_Base_ptr)pVar52.second._M_node);
      uVar30 = uVar30 + 1;
    } while (obj_size != uVar30);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170);
  local_170._8_8_ = local_170._8_8_ & 0xffffffff00000000;
  local_160 = (type)0x0;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_158 = tVar3;
  local_150 = tVar3;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_170,(key_type *)local_118);
      uVar29 = uVar30 + 1;
      *puVar15 = uVar29;
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      pVar52 = std::
               _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                              *)local_170,(key_type *)local_118);
      std::
      _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                      *)local_170,(_Base_ptr)pVar52.first._M_node,(_Base_ptr)pVar52.second._M_node);
      uVar30 = uVar29;
    } while (uVar29 != obj_size);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar51._0_8_ - lVar8),obj_size,auVar51._8_8_,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170);
  local_170._8_8_ = local_170._8_8_ & 0xffffffff00000000;
  local_160 = (type)0x0;
  local_148.i_ = 0;
  local_148.buffer_[0] = '\0';
  local_148.buffer_[1] = '\0';
  local_148.buffer_[2] = '\0';
  local_148.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_158 = tVar3;
  local_150 = tVar3;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar30 = 0;
    do {
      local_118._4_4_ = (uVar30 & 0xff) * 0x1010101;
      local_118._0_4_ = uVar30;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_170,(key_type *)local_118);
      uVar30 = uVar30 + 1;
      *puVar15 = uVar30;
    } while (obj_size != uVar30);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  for (tVar18 = tStack_158; tVar18 != tVar3;
      tVar18 = (type)std::_Rb_tree_increment((_Rb_tree_node_base *)tVar18)) {
    uVar30 = uVar30 ^ *(uint *)((long)tVar18 + 0x28);
  }
  lVar10 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar10 - lVar8),obj_size,start_memory_06,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_170);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}